

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

SpatialAcc *
iDynTree::convertMixedAccelerationToBodyFixedAcceleration
          (Vector6 *mixedAcc,Twist *bodyFixedVel,Rotation *inertial_R_body)

{
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *other;
  double *pdVar1;
  VectorFixSize<3U> *pVVar2;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *this;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *other_00;
  MatrixBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>_>
  *this_00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other_01;
  MatrixFixSize<3U,_3U> *in_RCX;
  SpatialVector<iDynTree::SpatialMotionVector> *in_RDX;
  VectorFixSize<6U> *in_RSI;
  SpatialVector<iDynTree::SpatialMotionVector> *in_RDI;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> angBodyFixedAcc;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> linBodyFixedAcc;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> inertial_R_body_eig;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> angBodyFixedTwist;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> linBodyFixedTwist;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> angMixedAcc;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> linMixedAcc;
  SpatialAcc *bodyFixedAcc;
  Stride<0,_0> *in_stack_fffffffffffffe50;
  Stride<0,_0> *this_01;
  PointerArgType in_stack_fffffffffffffe58;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>
  *in_stack_fffffffffffffe60;
  SpatialVector<iDynTree::SpatialMotionVector> *this_02;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffef0;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffef8;
  
  this_02 = in_RDI;
  SpatialAcc::SpatialAcc((SpatialAcc *)0x1c6659);
  other = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           *)VectorFixSize<6U>::data(in_RSI);
  Eigen::Stride<0,_0>::Stride(in_stack_fffffffffffffe50);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  pdVar1 = VectorFixSize<6U>::data(in_RSI);
  this_01 = (Stride<0,_0> *)(pdVar1 + 3);
  Eigen::Stride<0,_0>::Stride(this_01);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,this_01);
  pVVar2 = &SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(in_RDX)->super_Vector3;
  this = (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
          *)VectorFixSize<3U>::data(pVVar2);
  Eigen::Stride<0,_0>::Stride(this_01);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_fffffffffffffe60,(PointerArgType)this,this_01);
  pVVar2 = &SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(in_RDX)->super_Vector3;
  other_00 = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)VectorFixSize<3U>::data(pVVar2);
  Eigen::Stride<0,_0>::Stride(this_01);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)other_00,
             (PointerArgType)this,this_01);
  this_00 = (MatrixBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>_>
             *)MatrixFixSize<3U,_3U>::data(in_RCX);
  Eigen::Stride<0,_0>::Stride(this_01);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)other_00,
             (PointerArgType)this,this_01);
  pVVar2 = &SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(this_02)->super_Vector3;
  other_01 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)VectorFixSize<3U>::data(pVVar2);
  Eigen::Stride<0,_0>::Stride(this_01);
  Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)other_00,
             (PointerArgType)this,this_01);
  pVVar2 = &SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(this_02)->super_Vector3;
  VectorFixSize<3U>::data(pVVar2);
  Eigen::Stride<0,_0>::Stride(this_01);
  Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)other_00,
             (PointerArgType)this,this_01);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this);
  Eigen::
  MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>>
  ::operator*(this_00,other_00);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>,0>>
  ::operator-((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
               *)this_02,other_01);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_01,other);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this);
  Eigen::
  MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>>
  ::operator*(this_00,other_00);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_01,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
              *)other);
  return (SpatialAcc *)in_RDI;
}

Assistant:

SpatialAcc convertMixedAccelerationToBodyFixedAcceleration(const Vector6 & mixedAcc,
                                                           const Twist & bodyFixedVel,
                                                           const Rotation & inertial_R_body)
{
    SpatialAcc bodyFixedAcc;

    Eigen::Map<const Eigen::Vector3d> linMixedAcc(mixedAcc.data());
    Eigen::Map<const Eigen::Vector3d> angMixedAcc(mixedAcc.data()+3);

    Eigen::Map<const Eigen::Vector3d> linBodyFixedTwist(bodyFixedVel.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> angBodyFixedTwist(bodyFixedVel.getAngularVec3().data());

    Eigen::Map<const Matrix3dRowMajor> inertial_R_body_eig(inertial_R_body.data());

    Eigen::Map<Eigen::Vector3d> linBodyFixedAcc(bodyFixedAcc.getLinearVec3().data());
    Eigen::Map<Eigen::Vector3d> angBodyFixedAcc(bodyFixedAcc.getAngularVec3().data());

    linBodyFixedAcc = inertial_R_body_eig.transpose()*linMixedAcc - angBodyFixedTwist.cross(linBodyFixedTwist);
    angBodyFixedAcc = inertial_R_body_eig.transpose()*angMixedAcc;

    return bodyFixedAcc;
}